

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O3

static_huffman_data_model * __thiscall
crnlib::static_huffman_data_model::operator=
          (static_huffman_data_model *this,static_huffman_data_model *rhs)

{
  vector<unsigned_short> *this_00;
  vector<unsigned_char> *this_01;
  decoder_tables *other;
  uint32 *puVar1;
  uint16 *puVar2;
  decoder_tables *pdVar3;
  uint uVar4;
  
  if (this != rhs) {
    this->m_total_syms = rhs->m_total_syms;
    uVar4 = (rhs->m_codes).m_size;
    if ((this->m_codes).m_capacity < uVar4) {
      this_00 = &this->m_codes;
      if (this_00->m_p != (unsigned_short *)0x0) {
        crnlib_free(this_00->m_p);
        this_00->m_p = (unsigned_short *)0x0;
        (this->m_codes).m_size = 0;
        (this->m_codes).m_capacity = 0;
        uVar4 = (rhs->m_codes).m_size;
      }
      elemental_vector::increase_capacity
                ((elemental_vector *)this_00,uVar4,false,2,(object_mover)0x0,false);
    }
    else if ((this->m_codes).m_size != 0) {
      (this->m_codes).m_size = 0;
    }
    memcpy((this->m_codes).m_p,(rhs->m_codes).m_p,(ulong)(rhs->m_codes).m_size * 2);
    (this->m_codes).m_size = (rhs->m_codes).m_size;
    uVar4 = (rhs->m_code_sizes).m_size;
    if ((this->m_code_sizes).m_capacity < uVar4) {
      this_01 = &this->m_code_sizes;
      if (this_01->m_p != (uchar *)0x0) {
        crnlib_free(this_01->m_p);
        this_01->m_p = (uchar *)0x0;
        (this->m_code_sizes).m_size = 0;
        (this->m_code_sizes).m_capacity = 0;
        uVar4 = (rhs->m_code_sizes).m_size;
      }
      elemental_vector::increase_capacity
                ((elemental_vector *)this_01,uVar4,false,1,(object_mover)0x0,false);
    }
    else if ((this->m_code_sizes).m_size != 0) {
      (this->m_code_sizes).m_size = 0;
    }
    memcpy((this->m_code_sizes).m_p,(rhs->m_code_sizes).m_p,(ulong)(rhs->m_code_sizes).m_size);
    (this->m_code_sizes).m_size = (rhs->m_code_sizes).m_size;
    other = rhs->m_pDecode_tables;
    pdVar3 = this->m_pDecode_tables;
    if (other == (decoder_tables *)0x0) {
      if (pdVar3 != (decoder_tables *)0x0) {
        puVar1 = pdVar3->m_lookup;
        if ((puVar1 != (uint32 *)0x0) && ((puVar1[-2] ^ puVar1[-1]) == 0xffffffff)) {
          crnlib_free(puVar1 + -4);
        }
        puVar2 = pdVar3->m_sorted_symbol_order;
        if ((puVar2 != (uint16 *)0x0) &&
           ((*(uint *)(puVar2 + -4) ^ *(uint *)(puVar2 + -2)) == 0xffffffff)) {
          crnlib_free(puVar2 + -8);
        }
        crnlib_free(pdVar3);
      }
      this->m_pDecode_tables = (decoder_tables *)0x0;
    }
    else if (pdVar3 == (decoder_tables *)0x0) {
      pdVar3 = (decoder_tables *)crnlib_malloc(0xc0);
      pdVar3->m_table_shift = 0;
      pdVar3->m_table_max_code = 0;
      pdVar3->m_decode_start_code_size = 0;
      pdVar3->m_sorted_symbol_order = (uint16 *)0x0;
      *(undefined8 *)&pdVar3->m_cur_lookup_size = 0;
      *(undefined8 *)((long)&pdVar3->m_lookup + 4) = 0;
      prefix_coding::decoder_tables::operator=(pdVar3,other);
      this->m_pDecode_tables = pdVar3;
    }
    else {
      prefix_coding::decoder_tables::operator=(pdVar3,other);
    }
    this->m_encoding = rhs->m_encoding;
  }
  return this;
}

Assistant:

static_huffman_data_model& static_huffman_data_model::operator=(const static_huffman_data_model& rhs) {
  if (this == &rhs)
    return *this;

  m_total_syms = rhs.m_total_syms;
  m_codes = rhs.m_codes;
  m_code_sizes = rhs.m_code_sizes;

  if (rhs.m_pDecode_tables) {
    if (m_pDecode_tables)
      *m_pDecode_tables = *rhs.m_pDecode_tables;
    else
      m_pDecode_tables = crnlib_new<prefix_coding::decoder_tables>(*rhs.m_pDecode_tables);
  } else {
    crnlib_delete(m_pDecode_tables);
    m_pDecode_tables = NULL;
  }

  m_encoding = rhs.m_encoding;

  return *this;
}